

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackContainer.h
# Opt level: O2

void __thiscall
slang::
StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>::
deallocate(StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>
           *this,sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *p,size_t n)

{
  sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> **ppsVar1;
  
  if ((this->storage <= p) && (ppsVar1 = &this->storage->ptr, p < ppsVar1)) {
    if (p + n != *ppsVar1) {
      return;
    }
    *ppsVar1 = p;
    return;
  }
  operator_delete(p);
  return;
}

Assistant:

void deallocate(T* p, std::size_t n) noexcept {
        // If the pointer is in our buffer, possibly "deallocate" by moving the high water mark
        // back. Otherwise it was heap allocated and we must free with delete.
        if (std::less_equal<T*>()(storage->getBuffer(), p) &&
            std::less<T*>()(p, storage->getBuffer() + N)) {
            if (p + n == storage->ptr)
                storage->ptr = p;
        }
        else {
            ::operator delete(p);
        }
    }